

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

CBData * __thiscall asmjit::CodeBuilder::newDataNode(CodeBuilder *this,void *data,uint32_t size)

{
  CBData *pCVar1;
  ulong *puVar2;
  uint in_EDX;
  size_t *in_RSI;
  size_t in_RDI;
  void *cloned;
  size_t remainingBytes;
  uint8_t *ptr;
  size_t allocatedSize;
  char *in_stack_00000300;
  int in_stack_0000030c;
  char *in_stack_00000310;
  size_t *local_b0;
  Zone *in_stack_ffffffffffffff60;
  size_t *local_78;
  ZoneHeap *in_stack_ffffffffffffffa8;
  
  local_b0 = in_RSI;
  if (0x14 < in_EDX) {
    puVar2 = (ulong *)(in_RDI + 0xa0);
    local_78 = (size_t *)*puVar2;
    if ((ulong)(*(long *)(in_RDI + 0xa8) - (long)local_78) < (ulong)in_EDX) {
      local_78 = (size_t *)Zone::_alloc(in_stack_ffffffffffffff60,in_RDI);
    }
    else {
      *puVar2 = (ulong)in_EDX + *puVar2;
      if (*(ulong *)(in_RDI + 0xa8) < *puVar2) {
        DebugUtils::assertionFailed(in_stack_00000310,in_stack_0000030c,in_stack_00000300);
      }
    }
    if (local_78 == (size_t *)0x0) {
      return (CBData *)0x0;
    }
    if (in_RSI != (size_t *)0x0) {
      memcpy(local_78,in_RSI,(ulong)in_EDX);
    }
    local_b0 = local_78;
  }
  if (*(long *)(in_RDI + 0xe0) != 0) {
    pCVar1 = (CBData *)ZoneHeap::_alloc(in_stack_ffffffffffffffa8,in_RDI,local_b0);
    (pCVar1->super_CBNode)._prev = (CBNode *)0x0;
    (pCVar1->super_CBNode)._next = (CBNode *)0x0;
    (pCVar1->super_CBNode)._type = '\x02';
    (pCVar1->super_CBNode)._opCount = '\0';
    (pCVar1->super_CBNode)._flags = (uint16_t)*(undefined4 *)(in_RDI + 0x18c);
    (pCVar1->super_CBNode)._position = *(uint32_t *)(in_RDI + 0x188);
    (pCVar1->super_CBNode)._inlineComment = (char *)0x0;
    (pCVar1->super_CBNode)._passData = (void *)0x0;
    if (in_EDX < 0x15) {
      if (local_b0 != (size_t *)0x0) {
        memcpy(&pCVar1->field_0,local_b0,(ulong)in_EDX);
      }
    }
    else {
      *(size_t **)&pCVar1->field_0 = local_b0;
    }
    (pCVar1->field_0).field_0._size = in_EDX;
    return pCVar1;
  }
  DebugUtils::assertionFailed(in_stack_00000310,in_stack_0000030c,in_stack_00000300);
}

Assistant:

CBData* CodeBuilder::newDataNode(const void* data, uint32_t size) noexcept {
  if (size > CBData::kInlineBufferSize) {
    void* cloned = _cbDataZone.alloc(size);
    if (!cloned) return nullptr;

    if (data) ::memcpy(cloned, data, size);
    data = cloned;
  }

  return newNodeT<CBData>(const_cast<void*>(data), size);
}